

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall cmFileInstaller::DefaultFilePermissions(cmFileInstaller *this)

{
  mode_t *pmVar1;
  int iVar2;
  cmMakefile *this_00;
  bool bVar3;
  allocator<char> local_41;
  string local_40;
  
  cmFileCopier::DefaultFilePermissions(&this->super_cmFileCopier);
  iVar2 = *(int *)&(this->super_cmFileCopier).field_0xf4;
  if (iVar2 - 2U < 2) {
    this_00 = (this->super_cmFileCopier).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_INSTALL_SO_NO_EXE",&local_41);
    bVar3 = cmMakefile::IsOn(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar3) {
      return;
    }
  }
  else if ((iVar2 != 0) && (iVar2 != 5)) {
    return;
  }
  pmVar1 = &(this->super_cmFileCopier).FilePermissions;
  *(byte *)pmVar1 = (byte)*pmVar1 | 0x49;
  return;
}

Assistant:

void cmFileInstaller::DefaultFilePermissions()
{
  this->cmFileCopier::DefaultFilePermissions();
  // Add execute permissions based on the target type.
  switch (this->InstallType) {
    case cmInstallType_SHARED_LIBRARY:
    case cmInstallType_MODULE_LIBRARY:
      if (this->Makefile->IsOn("CMAKE_INSTALL_SO_NO_EXE")) {
        break;
      }
      CM_FALLTHROUGH;
    case cmInstallType_EXECUTABLE:
    case cmInstallType_PROGRAMS:
      this->FilePermissions |= mode_owner_execute;
      this->FilePermissions |= mode_group_execute;
      this->FilePermissions |= mode_world_execute;
      break;
    default:
      break;
  }
}